

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O2

void Kf_ManStoreAddUnit(Vec_Int_t *vTemp,int iObj,int Time,float Area)

{
  int iVar1;
  
  iVar1 = 1;
  Vec_IntAddToEntry(vTemp,0,1);
  Vec_IntPush(vTemp,1);
  iVar1 = Abc_Var2Lit(iObj,iVar1);
  Vec_IntPush(vTemp,iVar1);
  Vec_IntPush(vTemp,2);
  Vec_IntPush(vTemp,Time);
  Vec_IntPush(vTemp,(int)Area);
  return;
}

Assistant:

static inline void Kf_ManStoreAddUnit( Vec_Int_t * vTemp, int iObj, int Time, float Area )
{
    Vec_IntAddToEntry( vTemp, 0, 1 );
    Vec_IntPush( vTemp, 1 );                    // cut size
    Vec_IntPush( vTemp, Abc_Var2Lit(iObj, 0) ); // leaf
    Vec_IntPush( vTemp, 2 );                    // function
    Vec_IntPush( vTemp, Time );                 // delay
    Vec_IntPush( vTemp, Abc_Float2Int(Area) );  // area
}